

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_function_pointer_kernel_1.h
# Opt level: O3

int __thiscall
dlib::bfp1_helpers::
bound_function_helper_T<dlib::bfp1_helpers::bound_function_helper<void,_int,_void,_void,_void>_>::
clone(bound_function_helper_T<dlib::bfp1_helpers::bound_function_helper<void,_int,_void,_void,_void>_>
      *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  type *ptVar1;
  type *ptVar2;
  type *ptVar3;
  mfp_kernel_1_base_class<1UL> *pmVar4;
  
  *(undefined8 *)(__fn + 8) = 0;
  *(undefined8 *)(__fn + 0x10) = 0;
  *(undefined8 *)(__fn + 0x18) = 0;
  *(undefined8 *)(__fn + 0x20) = 0;
  *(mfp_kernel_1_base_class<1UL> **)(__fn + 0x60) = (mfp_kernel_1_base_class<1UL> *)(__fn + 0x30);
  *(undefined8 *)(__fn + 0x38) = 0;
  *(undefined4 *)(__fn + 0x40) = 2;
  *(undefined1 (*) [16])(__fn + 0x48) = ZEXT416(0) << 0x40;
  *(undefined ***)(__fn + 0x30) = &PTR__mp_base_base_001fa948;
  *(undefined ***)__fn = &PTR__bound_function_helper_base_001faa18;
  *(undefined8 *)(__fn + 0x70) = 0;
  ptVar1 = (this->super_bound_function_helper<void,_int,_void,_void,_void>).
           super_bound_function_helper_base<int,_void,_void,_void>.arg2;
  ptVar2 = (this->super_bound_function_helper<void,_int,_void,_void,_void>).
           super_bound_function_helper_base<int,_void,_void,_void>.arg3;
  ptVar3 = (this->super_bound_function_helper<void,_int,_void,_void,_void>).
           super_bound_function_helper_base<int,_void,_void,_void>.arg4;
  *(type_conflict2 **)(__fn + 8) =
       (this->super_bound_function_helper<void,_int,_void,_void,_void>).
       super_bound_function_helper_base<int,_void,_void,_void>.arg1;
  *(type **)(__fn + 0x10) = ptVar1;
  *(type **)(__fn + 0x18) = ptVar2;
  *(type **)(__fn + 0x20) = ptVar3;
  *(_func_void_int **)(__fn + 0x70) =
       (this->super_bound_function_helper<void,_int,_void,_void,_void>).fp;
  pmVar4 = mfp_kernel_1_base_class<1UL>::operator=
                     ((mfp_kernel_1_base_class<1UL> *)(__fn + 0x30),
                      &(this->super_bound_function_helper<void,_int,_void,_void,_void>).
                       super_bound_function_helper_base<int,_void,_void,_void>.mfp.
                       super_mfp_kernel_1_base_class<1UL>);
  return (int)pmVar4;
}

Assistant:

bound_function_helper_base():arg1(0), arg2(0), arg3(0), arg4(0) {}